

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O2

TProb<double> * __thiscall
libDAI::TProb<double>::sgn(TProb<double> *__return_storage_ptr__,TProb<double> *this)

{
  double dVar1;
  pointer pdVar2;
  size_t i;
  ulong uVar3;
  double s;
  value_type_conflict3 local_38;
  
  (__return_storage_ptr__->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::reserve
            (&__return_storage_ptr__->_p,
             (long)(this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  for (uVar3 = 0;
      pdVar2 = (this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar2 >> 3);
      uVar3 = uVar3 + 1) {
    local_38 = 0.0;
    dVar1 = pdVar2[uVar3];
    if (dVar1 <= 0.0) {
      if (dVar1 < 0.0) {
        local_38 = -1.0;
      }
    }
    else {
      local_38 = 1.0;
    }
    std::vector<double,_std::allocator<double>_>::push_back(&__return_storage_ptr__->_p,&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

TProb<T> sgn() const {
                TProb<T> x;
                x._p.reserve( size() );
                for( size_t i = 0; i < size(); i++ ) {
                    T s = 0;
                    if( _p[i] > 0 )
                        s = 1;
                    else if( _p[i] < 0 )
                        s = -1;
                    x._p.push_back( s );
                }
                return x;
            }